

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlHandle __thiscall despot::util::tinyxml::TiXmlHandle::FirstChild(TiXmlHandle *this,char *value)

{
  int iVar1;
  char *in_RDX;
  TiXmlNode *pTVar2;
  
  if (*(long *)value != 0) {
    for (pTVar2 = *(TiXmlNode **)(*(long *)value + 0x28); pTVar2 != (TiXmlNode *)0x0;
        pTVar2 = pTVar2->next) {
      iVar1 = strcmp(((pTVar2->value).rep_)->str,in_RDX);
      if (iVar1 == 0) goto LAB_001720f0;
    }
    pTVar2 = (TiXmlNode *)0x0;
LAB_001720f0:
    if (pTVar2 != (TiXmlNode *)0x0) goto LAB_001720f8;
  }
  pTVar2 = (TiXmlNode *)0x0;
LAB_001720f8:
  this->node = pTVar2;
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::FirstChild(const char * value) const {
	if (node) {
		TiXmlNode* child = node->FirstChild(value);
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}